

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall QTreeWidgetItem::isFirstColumnSpanned(QTreeWidgetItem *this)

{
  QTreeView *this_00;
  int row;
  bool bVar1;
  QTreeModel *__s;
  long in_FS_OFFSET;
  QModelIndex local_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QTreeWidgetItem *local_38;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  __s = treeModel(this,(QTreeWidget *)0x0);
  if (__s != (QTreeModel *)0x0) {
    if (__s->headerItem == this) {
      bVar1 = false;
    }
    else {
      local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QTreeModel::index((QTreeModel *)&local_48,(char *)__s,(int)this);
      this_00 = &this->view->super_QTreeView;
      row = (int)local_48;
      QModelIndex::parent(&local_60,(QModelIndex *)&local_48);
      bVar1 = QTreeView::isFirstColumnSpanned(this_00,row,&local_60);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidgetItem::isFirstColumnSpanned() const
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return false;
    const QModelIndex index = model->index(this, 0);
    return view->isFirstColumnSpanned(index.row(), index.parent());
}